

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

void sexp_utf8_encode_char(uchar *p,int len,int c)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int c_local;
  int len_local;
  uchar *p_local;
  
  bVar3 = (byte)c;
  bVar1 = (byte)(c >> 6);
  if (len == 2) {
    *p = bVar1 - 0x40;
    p[1] = (bVar3 & 0x3f) + 0x80;
  }
  else {
    bVar2 = (byte)(c >> 0xc);
    if (len == 3) {
      *p = bVar2 - 0x20;
      p[1] = (bVar1 & 0x3f) + 0x80;
      p[2] = (bVar3 & 0x3f) + 0x80;
    }
    else if (len == 4) {
      *p = (char)(c >> 0x12) + 0xf0;
      p[1] = (bVar2 & 0x3f) + 0x80;
      p[2] = (bVar1 & 0x3f) + 0x80;
      p[3] = (bVar3 & 0x3f) + 0x80;
    }
    else {
      *p = bVar3;
    }
  }
  return;
}

Assistant:

void sexp_utf8_encode_char (unsigned char* p, int len, int c) {
  switch (len) {
  case 4:  *p++ = (0xF0 + ((c)>>18)); *p++ = (0x80 + ((c>>12)&0x3F));
    *p++ = (0x80 + ((c>>6)&0x3F));    *p = (0x80 + (c&0x3F)); break;
  case 3:  *p++ = (0xE0 + ((c)>>12)); *p++ = (0x80 + ((c>>6)&0x3F));
    *p = (0x80 + (c&0x3F)); break;
  case 2:  *p++ = (0xC0 + ((c)>>6));  *p = (0x80 + (c&0x3F)); break;
  default: *p = c; break;
  }
}